

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O0

void __thiscall ACTable::Sort(ACTable *this,ACTColumnsTy _col,bool _asc)

{
  anon_class_8_2_37df132e __comp;
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_> __first;
  reference pvVar1;
  iterator __last;
  iterator iVar2;
  byte in_DL;
  anon_class_4_1_89885dbf in_ESI;
  vector<FDInfo,_std::allocator<FDInfo>_> *in_RDI;
  array<ACTColDefTy,_39UL> *in_stack_ffffffffffffffb0;
  ACTColumnsTy in_stack_ffffffffffffffc0;
  ACTColumnsTy in_stack_ffffffffffffffc4;
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>
  in_stack_ffffffffffffffd0;
  
  pvVar1 = std::array<ACTColDefTy,_39UL>::at(in_stack_ffffffffffffffb0,(size_type)in_RDI);
  if ((pvVar1->colAlign == IM_ALIGN_RIGHT) || (in_ESI._col == ACT_COL_PHASE)) {
    std::vector<FDInfo,_std::allocator<FDInfo>_>::begin(in_RDI);
    std::vector<FDInfo,_std::allocator<FDInfo>_>::end(in_RDI);
    __comp._4_4_ = in_stack_ffffffffffffffc4;
    __comp._col = in_stack_ffffffffffffffc0;
    std::
    sort<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,ACTable::Sort(ACTColumnsTy,bool)::__0>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,__comp);
    in_ESI._col = in_stack_ffffffffffffffc4;
  }
  else {
    iVar2 = std::vector<FDInfo,_std::allocator<FDInfo>_>::begin(in_RDI);
    __last = std::vector<FDInfo,_std::allocator<FDInfo>_>::end(in_RDI);
    std::
    sort<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,ACTable::Sort(ACTColumnsTy,bool)::__1>
              ((__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>)
               iVar2._M_current,
               (__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>)
               __last._M_current,in_ESI);
  }
  if ((in_DL & 1) == 0) {
    iVar2 = std::vector<FDInfo,_std::allocator<FDInfo>_>::begin(in_RDI);
    std::vector<FDInfo,_std::allocator<FDInfo>_>::end(in_RDI);
    __first._M_current._4_4_ = in_ESI._col;
    __first._M_current._0_4_ = in_stack_ffffffffffffffc0;
    std::reverse<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>>
              (__first,(__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>)
                       iVar2._M_current);
  }
  return;
}

Assistant:

void ACTable::Sort (ACTColumnsTy _col, bool _asc)
{
    // All right-aligned data is treated as numeric, using the numeric `vf` array,
    // so is the "flight phase", which gets sorted by its numeric value, too:
    if (gCols.at(_col).colAlign == ImGui::IM_ALIGN_RIGHT ||
        _col == ACT_COL_PHASE) {
        std::sort(vecFDI.begin(), vecFDI.end(),
                  [_col,_asc](const FDInfo& a, const FDInfo& b)
        {
            const float af = a.vf[_col]; const bool a_nan = std::isnan(af);
            const float bf = b.vf[_col]; const bool b_nan = std::isnan(bf);
            if (!a_nan && !b_nan)       // standard case: both value defined
                return af < bf;
            if (a_nan && b_nan)         // both NAN -> considered equal, for a stable sort let the key decide
                return a.key < b.key;
            return a_nan != _asc;       // one of them is NAN -> make NAN appear always at the end
        });
    } else {
        // otherwise we sort by text
        std::sort(vecFDI.begin(), vecFDI.end(),
                  [_col](const FDInfo& a, const FDInfo& b)
        {
            const int cmp = a.v[_col].compare(b.v[_col]);
            return
            cmp == 0 ? a.key < b.key :  // in case of equality let the key decide for a stable sorting order
            cmp < 0;
        });
    }
    
    // Sort descending?
    if (!_asc)
        std::reverse(vecFDI.begin(), vecFDI.end());
}